

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

void Cof_ManInsertEntry_rec(Vec_Ptr_t *vNodes,Cof_Obj_t *pNode,int nNodeMax)

{
  uint uVar1;
  size_t __size;
  Cof_Obj_t *pCVar2;
  void **ppvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = vNodes->nSize;
  if (uVar5 == 0) {
    iVar4 = 0;
    ppvVar3 = vNodes->pArray;
    if (vNodes->nCap == 0) {
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
        iVar4 = 0;
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
        iVar4 = vNodes->nSize;
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = 0x10;
    }
  }
  else {
    if ((int)uVar5 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    ppvVar3 = vNodes->pArray;
    uVar1 = uVar5 - 1;
    vNodes->nSize = uVar1;
    pCVar2 = (Cof_Obj_t *)ppvVar3[uVar1];
    if (*(uint *)pCVar2 >> 8 < *(uint *)pNode >> 8) {
      Cof_ManInsertEntry_rec(vNodes,pNode,nNodeMax);
      uVar5 = vNodes->nSize;
      if (nNodeMax <= (int)uVar5) {
        return;
      }
      if (uVar5 == vNodes->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar4 = vNodes->nSize;
      pNode = pCVar2;
    }
    else {
      uVar6 = vNodes->nCap;
      if (uVar1 == uVar6) {
        if (uVar5 < 0x11) {
          ppvVar3 = (void **)realloc(ppvVar3,0x80);
          uVar6 = 0x10;
        }
        else {
          uVar6 = uVar1 * 2;
          ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar6 * 8);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar6;
      }
      iVar4 = vNodes->nSize;
      uVar5 = iVar4 + 1;
      vNodes->nSize = uVar5;
      ppvVar3[iVar4] = pCVar2;
      if (nNodeMax <= (int)uVar5) {
        return;
      }
      if (uVar5 == uVar6) {
        if (iVar4 < 0xf) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          __size = (ulong)(uVar6 * 2) * 8;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(__size);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,__size);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar4 = vNodes->nSize;
    }
  }
  vNodes->nSize = iVar4 + 1;
  ppvVar3[iVar4] = pNode;
  return;
}

Assistant:

void Cof_ManInsertEntry_rec( Vec_Ptr_t * vNodes, Cof_Obj_t * pNode, int nNodeMax )
{
    Cof_Obj_t * pLast;
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrPush(vNodes, pNode);
        return;
    }
    pLast = (Cof_Obj_t *)Vec_PtrPop(vNodes);
    if ( Cof_ObjFanoutNum(pLast) < Cof_ObjFanoutNum(pNode) )
    {
        Cof_ManInsertEntry_rec( vNodes, pNode, nNodeMax );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pLast );
    }
    else
    {
        Vec_PtrPush( vNodes, pLast );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pNode );
    }
}